

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWriter.h
# Opt level: O0

void __thiscall LogWriter::reportEdge(LogWriter *this,uint v1,uint v2)

{
  size_type sVar1;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_RDI;
  mapped_type *in_stack_ffffffffffffff98;
  key_type_conflict *in_stack_ffffffffffffffc8;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  sVar1 = std::
          map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::count(in_RDI,(key_type_conflict *)in_stack_ffffffffffffff98);
  if (sVar1 == 0) {
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x24c94a);
    in_stack_ffffffffffffff98 =
         std::
         map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,in_stack_ffffffffffffff98
              );
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x24c97d);
  }
  sVar1 = std::
          map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::count(in_RDI,(key_type_conflict *)in_stack_ffffffffffffff98);
  if (sVar1 == 0) {
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x24c9d0);
    std::
    map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,in_stack_ffffffffffffff98
              );
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x24ca03);
  }
  std::
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
             (value_type_conflict1 *)in_stack_ffffffffffffff98);
  std::
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
             (value_type_conflict1 *)in_stack_ffffffffffffff98);
  return;
}

Assistant:

void reportEdge(unsigned int v1, unsigned int v2) {
        if (vertices_.count(v1) == 0) vertices_[v1] = std::list<unsigned int>();
        if (vertices_.count(v2) == 0) vertices_[v2] = std::list<unsigned int>();

        vertices_[v1].push_back(v2);
        vertices_[v2].push_back(v1);
    }